

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::color3d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *result)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char c;
  double3 v;
  char local_79;
  color3d local_78;
  string local_58;
  
  pcVar2 = (result->
           super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>).
      _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (result->super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
    )._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<double,3ul>(this,(array<double,_3UL> *)&local_58);
    if (bVar5) {
      local_78.r = (double)local_58._M_dataplus._M_p;
      local_78.g = (double)local_58._M_string_length;
      local_78.b = (double)local_58.field_2._M_allocated_capacity;
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>::
        _M_realloc_insert<tinyusdz::value::color3d_const&>
                  ((vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>> *)
                   result,iVar3,&local_78);
      }
      else {
        (iVar3._M_current)->b = (double)local_58.field_2._M_allocated_capacity;
        (iVar3._M_current)->r = (double)local_58._M_dataplus._M_p;
        (iVar3._M_current)->g = (double)local_58._M_string_length;
        ppcVar1 = &(result->
                   super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0041d6d8;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,&local_79);
        if (!bVar5) {
          return false;
        }
        if (local_79 == sep) {
          bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = LookChar1(this,(char *)&local_58);
          if (!bVar5) {
            return false;
          }
          iVar6 = 3;
          if ((char)local_58._M_dataplus._M_p != end_symbol) goto LAB_0041d631;
        }
        else {
LAB_0041d631:
          if (local_79 != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar7 = pSVar4->idx_ - 1, uVar7 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar7;
            }
            goto LAB_0041d6d8;
          }
          bVar5 = SkipWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = ParseBasicTypeTuple<double,3ul>(this,(array<double,_3UL> *)&local_58);
          if (bVar5) {
            local_78.r = (double)local_58._M_dataplus._M_p;
            local_78.g = (double)local_58._M_string_length;
            local_78.b = (double)local_58.field_2._M_allocated_capacity;
            iVar3._M_current =
                 (result->
                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->
                super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>::
              _M_realloc_insert<tinyusdz::value::color3d_const&>
                        ((vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>
                          *)result,iVar3,&local_78);
            }
            else {
              (iVar3._M_current)->b = (double)local_58.field_2._M_allocated_capacity;
              (iVar3._M_current)->r = (double)local_58._M_dataplus._M_p;
              (iVar3._M_current)->g = (double)local_58._M_string_length;
              ppcVar1 = &(result->
                         super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
            iVar6 = 0;
          }
          else {
            iVar6 = 3;
          }
        }
      } while (iVar6 == 0);
      if (iVar6 == 1) {
        return false;
      }
LAB_0041d6d8:
      if ((result->
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar9 = "Empty array.\n";
      pcVar8 = "";
    }
    else {
      pcVar9 = "Not starting with the value of requested type.\n";
      pcVar8 = "";
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar9,pcVar8);
    PushError(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}